

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

char * str_find_nocase(char *haystack,char *needle)

{
  int iVar1;
  int iVar2;
  char *in_RSI;
  char *in_RDI;
  bool bVar3;
  char *b;
  char *a;
  char *local_28;
  char *local_20;
  char *local_10;
  
  local_10 = in_RDI;
  while( true ) {
    if (*local_10 == '\0') {
      return (char *)0x0;
    }
    local_20 = local_10;
    local_28 = in_RSI;
    while( true ) {
      bVar3 = false;
      if ((*local_20 != '\0') && (bVar3 = false, *local_28 != '\0')) {
        iVar1 = tolower((int)*local_20);
        iVar2 = tolower((int)*local_28);
        bVar3 = iVar1 == iVar2;
      }
      if (!bVar3) break;
      local_20 = local_20 + 1;
      local_28 = local_28 + 1;
    }
    if (*local_28 == '\0') break;
    local_10 = local_10 + 1;
  }
  return local_10;
}

Assistant:

const char *str_find_nocase(const char *haystack, const char *needle)
{
	while(*haystack) /* native implementation */
	{
		const char *a = haystack;
		const char *b = needle;
		while(*a && *b && tolower(*a) == tolower(*b))
		{
			a++;
			b++;
		}
		if(!(*b))
			return haystack;
		haystack++;
	}

	return 0;
}